

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall SQCompilation::SQParser::ShiftExp(SQParser *this)

{
  long lVar1;
  uint uVar2;
  Expr *pEVar3;
  Expr *lhs;
  int iVar4;
  
  uVar2 = this->_depth;
  if (500 < uVar2) {
    reportDiagnostic(this,0x1d);
    uVar2 = this->_depth;
  }
  this->_depth = uVar2 + 1;
  pEVar3 = PlusExp(this);
  iVar4 = 1;
  do {
    uVar2 = this->_depth;
    if (500 < uVar2) {
      reportDiagnostic(this,0x1d);
      uVar2 = this->_depth;
    }
    this->_depth = uVar2 + 1;
    lVar1 = this->_token;
    if (lVar1 == 0x128) {
      lhs = (Expr *)0x25;
    }
    else if (lVar1 == 0x129) {
      lhs = (Expr *)0x24;
    }
    else {
      lhs = (Expr *)0x23;
      if (lVar1 != 0x132) {
        this->_depth = uVar2 - iVar4;
        return pEVar3;
      }
    }
    iVar4 = iVar4 + 1;
    pEVar3 = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>(this,0x1620b8,TO_BLOCK,lhs)
    ;
  } while( true );
}

Assistant:

Expr* SQParser::ShiftExp()
{
    NestingChecker nc(this);
    Expr *lhs = PlusExp();
    for (;;) {
        nc.inc();
        switch (_token) {
        case TK_USHIFTR: lhs = BIN_EXP(&SQParser::PlusExp, TO_USHR, lhs); break;
        case TK_SHIFTL: lhs = BIN_EXP(&SQParser::PlusExp, TO_SHL, lhs); break;
        case TK_SHIFTR: lhs = BIN_EXP(&SQParser::PlusExp, TO_SHR, lhs); break;
        default: return lhs;
        }
    }
}